

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<double,_std::allocator<double>_> *variable,
          string *value)

{
  char *res;
  double local_18;
  char *local_10;
  
  local_10 = (char *)0x0;
  local_18 = strtod((value->_M_dataplus)._M_p,&local_10);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(variable,&local_18);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<double>* variable,
                                            const std::string& value)
{
  char* res = 0;
  variable->push_back(strtod(value.c_str(), &res));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}